

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O0

int Abc_NtkMfsAfterICheck
              (Abc_Ntk_t *p,int nFrames,int nFramesAdd,Vec_Int_t *vFlops,Sfm_Par_t *pPars)

{
  int iVar1;
  int local_4c;
  Abc_Ntk_t *pAStack_48;
  int iPivot;
  Abc_Ntk_t *pNtk;
  int nNodes;
  int nFaninMax;
  Sfm_Ntk_t *pp;
  Sfm_Par_t *pPars_local;
  Vec_Int_t *vFlops_local;
  int nFramesAdd_local;
  int nFrames_local;
  Abc_Ntk_t *p_local;
  
  pp = (Sfm_Ntk_t *)pPars;
  pPars_local = (Sfm_Par_t *)vFlops;
  vFlops_local._0_4_ = nFramesAdd;
  vFlops_local._4_4_ = nFrames;
  _nFramesAdd_local = p;
  iVar1 = Abc_NtkIsLogic(p);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMfs.c"
                  ,0x1b5,
                  "int Abc_NtkMfsAfterICheck(Abc_Ntk_t *, int, int, Vec_Int_t *, Sfm_Par_t *)");
  }
  pNtk._4_4_ = Abc_NtkGetFaninMax(_nFramesAdd_local);
  if (pNtk._4_4_ < 7) {
    iVar1 = Abc_NtkHasSop(_nFramesAdd_local);
    if (iVar1 == 0) {
      Abc_NtkToSop(_nFramesAdd_local,-1,1000000000);
    }
    pAStack_48 = Abc_NtkUnrollAndDrop
                           (_nFramesAdd_local,vFlops_local._4_4_,(int)vFlops_local,
                            (Vec_Int_t *)pPars_local,&local_4c);
    Io_WriteBlifLogic(pAStack_48,"unroll_dump.blif",0);
    _nNodes = Abc_NtkExtractMfs2(pAStack_48,local_4c);
    pNtk._0_4_ = Sfm_NtkPerform(_nNodes,(Sfm_Par_t *)pp);
    if ((uint)pNtk != 0) {
      Abc_NtkInsertMfs(pAStack_48,_nNodes);
      if ((pp->vLevelsR).nCap != 0) {
        Abc_Print(1,"The network has %d nodes changed by \"mfs\".\n",(ulong)(uint)pNtk);
      }
      Abc_NtkReinsertNodes(_nFramesAdd_local,pAStack_48,local_4c);
    }
    Abc_NtkDelete(pAStack_48);
    Sfm_NtkFree(_nNodes);
    Abc_NtkSweep(_nFramesAdd_local,0);
    iVar1 = Abc_NtkHasSop(_nFramesAdd_local);
    if (iVar1 == 0) {
      Abc_NtkToSop(_nFramesAdd_local,-1,1000000000);
    }
    p_local._4_4_ = 1;
  }
  else {
    Abc_Print(1,
              "Currently \"mfs\" cannot process the network containing nodes with more than 6 fanins.\n"
             );
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Abc_NtkMfsAfterICheck( Abc_Ntk_t * p, int nFrames, int nFramesAdd, Vec_Int_t * vFlops, Sfm_Par_t * pPars )
{
    Sfm_Ntk_t * pp;
    int nFaninMax, nNodes;
    Abc_Ntk_t * pNtk;
    int iPivot;
    assert( Abc_NtkIsLogic(p) );
    // count fanouts
    nFaninMax = Abc_NtkGetFaninMax( p );
    if ( nFaninMax > 6 )
    {
        Abc_Print( 1, "Currently \"mfs\" cannot process the network containing nodes with more than 6 fanins.\n" );
        return 0;
    }
    if ( !Abc_NtkHasSop(p) )
        Abc_NtkToSop( p, -1, ABC_INFINITY );
    // derive unfolded network
    pNtk = Abc_NtkUnrollAndDrop( p, nFrames, nFramesAdd, vFlops, &iPivot );
    Io_WriteBlifLogic( pNtk, "unroll_dump.blif", 0 );
    // collect information
    pp = Abc_NtkExtractMfs2( pNtk, iPivot );
    // perform optimization
    nNodes = Sfm_NtkPerform( pp, pPars );
    if ( nNodes == 0 )
    {
//        Abc_Print( 1, "The network is not changed by \"mfs\".\n" );
    }
    else
    {
        Abc_NtkInsertMfs( pNtk, pp );
        if( pPars->fVerbose )
            Abc_Print( 1, "The network has %d nodes changed by \"mfs\".\n", nNodes );
        Abc_NtkReinsertNodes( p, pNtk, iPivot );
    }
    Abc_NtkDelete( pNtk );
    Sfm_NtkFree( pp );
    // perform final sweep
    Abc_NtkSweep( p, 0 );
    if ( !Abc_NtkHasSop(p) )
        Abc_NtkToSop( p, -1, ABC_INFINITY );
    return 1;

}